

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O1

void __thiscall ipx::Iterate::ComputeObjectives(Iterate *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  StateDetail SVar4;
  Model *pMVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  pointer pSVar10;
  pointer piVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pMVar5 = this->model_;
  iVar2 = pMVar5->num_rows_;
  iVar3 = pMVar5->num_cols_;
  if (this->postprocessed_ == true) {
    this->offset_ = 0.0;
    dVar16 = pMVar5->offset_;
    dVar15 = Dot(&pMVar5->c_,&this->x_);
    this->pobjective_ = dVar15 + dVar16;
    dVar16 = this->model_->offset_;
    dVar15 = Dot(&pMVar5->b_,&this->y_);
    this->dobjective_ = dVar15 + dVar16;
    uVar12 = iVar3 + iVar2;
    if (uVar12 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar12 < 0) {
      dVar16 = this->dobjective_;
      pdVar6 = (pMVar5->lb_)._M_data;
      pdVar7 = (pMVar5->ub_)._M_data;
      pdVar8 = (this->zl_)._M_data;
      pdVar9 = (this->zu_)._M_data;
      uVar13 = 0;
      do {
        dVar15 = pdVar6[uVar13];
        if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
          dVar16 = dVar16 + dVar15 * pdVar8[uVar13];
          this->dobjective_ = dVar16;
        }
        dVar15 = pdVar7[uVar13];
        if ((ulong)ABS(dVar15) < 0x7ff0000000000000) {
          dVar16 = dVar16 - dVar15 * pdVar9[uVar13];
          this->dobjective_ = dVar16;
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
  }
  else {
    this->offset_ = 0.0;
    dVar16 = pMVar5->offset_;
    this->pobjective_ = dVar16;
    uVar12 = iVar3 + iVar2;
    if (uVar12 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar12 < 0) {
      dVar15 = this->offset_;
      dVar17 = this->pobjective_;
      pSVar10 = (this->variable_state_).
                super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->x_)._M_data;
      pdVar7 = (this->zl_)._M_data;
      pdVar8 = (this->zu_)._M_data;
      lVar14 = 0;
      do {
        iVar2 = *(int *)((long)pSVar10 + lVar14);
        dVar1 = *(double *)((long)pdVar6 + lVar14 * 2);
        if (iVar2 == 4) {
          dVar15 = dVar15 + dVar1 * *(double *)((long)(pMVar5->c_)._M_data + lVar14 * 2);
          this->offset_ = dVar15;
        }
        else {
          dVar17 = dVar17 + dVar1 * *(double *)((long)(pMVar5->c_)._M_data + lVar14 * 2);
          this->pobjective_ = dVar17;
        }
        if (iVar2 - 5U < 3) {
          dVar17 = dVar17 - (*(double *)((long)pdVar7 + lVar14 * 2) -
                            *(double *)((long)pdVar8 + lVar14 * 2)) *
                            *(double *)((long)pdVar6 + lVar14 * 2);
          this->pobjective_ = dVar17;
          dVar15 = dVar15 + (*(double *)((long)pdVar7 + lVar14 * 2) -
                            *(double *)((long)pdVar8 + lVar14 * 2)) *
                            *(double *)((long)pdVar6 + lVar14 * 2);
          this->offset_ = dVar15;
        }
        lVar14 = lVar14 + 4;
      } while ((ulong)uVar12 * 4 - lVar14 != 0);
    }
    dVar15 = Dot(&pMVar5->b_,&this->y_);
    this->dobjective_ = dVar16 + dVar15;
    if (0 < (int)uVar12) {
      dVar16 = this->dobjective_;
      pSVar10 = (this->variable_state_).
                super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->zl_)._M_data;
      pdVar7 = (this->zu_)._M_data;
      pdVar8 = (this->x_)._M_data;
      pdVar9 = (this->y_)._M_data;
      uVar13 = 0;
      do {
        SVar4 = pSVar10[uVar13];
        if ((SVar4 & ~BARRIER_BOXED) == BARRIER_LB) {
          dVar16 = dVar16 + (pMVar5->lb_)._M_data[uVar13] * pdVar6[uVar13];
          this->dobjective_ = dVar16;
        }
        if (SVar4 - BARRIER_UB < 2) {
          dVar16 = dVar16 - (pMVar5->ub_)._M_data[uVar13] * pdVar7[uVar13];
          this->dobjective_ = dVar16;
        }
        if (SVar4 == FIXED) {
          piVar11 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = piVar11[uVar13];
          lVar14 = (long)iVar2;
          iVar3 = piVar11[uVar13 + 1];
          dVar17 = 0.0;
          dVar15 = 0.0;
          if (iVar2 < iVar3) {
            do {
              dVar17 = dVar17 + pdVar9[(pMVar5->AI_).rowidx_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar14]] *
                                (pMVar5->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar14];
              lVar14 = lVar14 + 1;
              dVar15 = dVar17;
            } while (iVar3 != lVar14);
          }
          dVar16 = dVar16 - dVar15 * pdVar8[uVar13];
          this->dobjective_ = dVar16;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
    }
  }
  return;
}

Assistant:

void Iterate::ComputeObjectives() const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& b = model_.b();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    if (postprocessed_) {
        // Compute objective values as defined for the LP model.
        offset_ = 0.0;
        pobjective_ = model_.offset() + Dot(c, x_);
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                dobjective_ += lb[j] * zl_[j];
            if (std::isfinite(ub[j]))
                dobjective_ -= ub[j] * zu_[j];
        }
    } else {
        // Compute objective values for the LP that is solved at the very moment
        // (after fixing and implying variables). The offset is such that
        // pobjective_ + offset_ is the primal objective after postprocessing.
        offset_ = 0.0;
        pobjective_ = model_.offset();
        for (Int j = 0; j < n+m; j++) {
            if (StateOf(j) != State::fixed)
                pobjective_ += c[j] * x_[j];
            else
                offset_ += c[j] * x_[j];
            if (is_implied(j)) {
                // At the moment, we are solving an LP with the cost coefficient
                // for variable j decreased by zl[j]-zu[j].
                pobjective_ -= (zl_[j]-zu_[j]) * x_[j];
                offset_ += (zl_[j]-zu_[j]) * x_[j];
            }
        }
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (has_barrier_lb(j))
                dobjective_ += lb[j] * zl_[j];
            if (has_barrier_ub(j))
                dobjective_ -= ub[j] * zu_[j];
            if (StateOf(j) == State::fixed)
                // At the moment, we are solving the LP without variable j,
                // but with the RHS decreased by AI[:,j]*x[j].
                dobjective_ -= x_[j] * DotColumn(AI, j, y_);
        }
    }
}